

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O0

Gia_Man_t * Gia_ManVerifyCexAndMove(Gia_Man_t *pGia,Abc_Cex_t *p)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  bool bVar8;
  int local_48;
  int local_44;
  int iBit;
  int k;
  int i;
  int RetValue;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Abc_Cex_t *p_local;
  Gia_Man_t *pGia_local;
  
  local_48 = 0;
  Gia_ManCleanMark0(pGia);
  iBit = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(pGia);
    bVar8 = false;
    if (iBit < iVar3) {
      iVar3 = Gia_ManPiNum(pGia);
      pObjRi = Gia_ManCi(pGia,iVar3 + iBit);
      bVar8 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_48);
    *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
    iBit = iBit + 1;
    local_48 = local_48 + 1;
  }
  for (iBit = 0; iBit <= p->iFrame; iBit = iBit + 1) {
    local_44 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(pGia);
      bVar8 = false;
      if (local_44 < iVar3) {
        pObjRi = Gia_ManCi(pGia,local_44);
        bVar8 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_48);
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      local_44 = local_44 + 1;
      local_48 = local_48 + 1;
    }
    local_44 = 0;
    while( true ) {
      bVar8 = false;
      if (local_44 < pGia->nObjs) {
        pObjRi = Gia_ManObj(pGia,local_44);
        bVar8 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar3 = Gia_ObjIsAnd(pObjRi);
      if (iVar3 != 0) {
        pGVar6 = Gia_ObjFanin0(pObjRi);
        uVar2 = *(ulong *)pGVar6;
        uVar5 = Gia_ObjFaninC0(pObjRi);
        pGVar6 = Gia_ObjFanin1(pObjRi);
        uVar1 = *(ulong *)pGVar6;
        uVar4 = Gia_ObjFaninC1(pObjRi);
        *(ulong *)pObjRi =
             *(ulong *)pObjRi & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1
             ) << 0x1e;
      }
      local_44 = local_44 + 1;
    }
    local_44 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(pGia->vCos);
      bVar8 = false;
      if (local_44 < iVar3) {
        pObjRi = Gia_ManCo(pGia,local_44);
        bVar8 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      pGVar6 = Gia_ObjFanin0(pObjRi);
      uVar2 = *(ulong *)pGVar6;
      uVar5 = Gia_ObjFaninC0(pObjRi);
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      local_44 = local_44 + 1;
    }
    if (iBit == p->iFrame) break;
    local_44 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(pGia);
      bVar8 = false;
      if (local_44 < iVar3) {
        iVar3 = Gia_ManPoNum(pGia);
        pObjRo = Gia_ManCo(pGia,iVar3 + local_44);
        bVar8 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(pGia);
          _i = Gia_ManCi(pGia,iVar3 + local_44);
          bVar8 = _i != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar8) break;
      *(ulong *)_i = *(ulong *)_i & 0xffffffffbfffffff |
                     (ulong)((uint)(*(ulong *)pObjRo >> 0x1e) & 1) << 0x1e;
      local_44 = local_44 + 1;
    }
  }
  if (local_48 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0x84,"Gia_Man_t *Gia_ManVerifyCexAndMove(Gia_Man_t *, Abc_Cex_t *)");
  }
  pGVar6 = Gia_ManPo(pGia,p->iPo);
  if ((*(ulong *)pGVar6 >> 0x1e & 1) == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0x86,"Gia_Man_t *Gia_ManVerifyCexAndMove(Gia_Man_t *, Abc_Cex_t *)");
  }
  local_44 = 0;
  while( true ) {
    iVar3 = Gia_ManPiNum(pGia);
    bVar8 = false;
    if (local_44 < iVar3) {
      pObjRi = Gia_ManCi(pGia,local_44);
      bVar8 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar3 = Gia_ManPoNum(pGia);
    bVar8 = false;
    if (local_44 < iVar3) {
      pObjRi = Gia_ManCo(pGia,local_44);
      bVar8 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(pGia);
    bVar8 = false;
    if (local_44 < iVar3) {
      iVar3 = Gia_ManPoNum(pGia);
      pObjRo = Gia_ManCo(pGia,iVar3 + local_44);
      bVar8 = false;
      if (pObjRo != (Gia_Obj_t *)0x0) {
        iVar3 = Gia_ManPiNum(pGia);
        _i = Gia_ManCi(pGia,iVar3 + local_44);
        bVar8 = _i != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar8) break;
    *(ulong *)pObjRo =
         *(ulong *)pObjRo & 0xffffffffbfffffff | (ulong)((uint)(*(ulong *)_i >> 0x1e) & 1) << 0x1e;
    local_44 = local_44 + 1;
  }
  pGVar7 = Gia_ManDupWithInit(pGia);
  Gia_ManCleanMark0(pGia);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManVerifyCexAndMove( Gia_Man_t * pGia, Abc_Cex_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Gia_ManCleanMark0(pGia);
    Gia_ManForEachRo( pGia, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pGia, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pGia, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pGia, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    RetValue = Gia_ManPo(pGia, p->iPo)->fMark0;
    assert( RetValue );
    // set PI/PO values to zero and transfer RO values to RI
    Gia_ManForEachPi( pGia, pObj, k )
        pObj->fMark0 = 0;
    Gia_ManForEachPo( pGia, pObj, k )
        pObj->fMark0 = 0;
    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, k )
        pObjRi->fMark0 = pObjRo->fMark0;
    // duplicate assuming CI/CO marks are set correctly
    pNew = Gia_ManDupWithInit( pGia );
    Gia_ManCleanMark0(pGia);
    return pNew;
}